

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SomeTests.cpp
# Opt level: O1

void __thiscall
OrderBookTests_OrderAdditionWorks_Test::~OrderBookTests_OrderAdditionWorks_Test
          (OrderBookTests_OrderAdditionWorks_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(OrderBookTests, OrderAdditionWorks)
{
    OrderBook book;
    book.add_bid(123, 456);
    auto bidask = book.get_bid_ask();
    EXPECT_TRUE(bidask.bid.is_initialized());\
    auto bid = bidask.bid.get();
    EXPECT_EQ(123, bid.first);
    EXPECT_EQ(456, bid.second);
}